

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

void draw_arrow1(Fl_Color col)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,col);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe999999999999a,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe999999999999a,0x3fd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3fe999999999999a,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0xbfe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(col,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe999999999999a,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe999999999999a,0x3fd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3fe999999999999a,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0xbfe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void draw_arrow1(Fl_Color col)
{
  fl_color(col);
  BP; vv(-0.8,-0.4); vv(-0.8,0.4); vv(0.0,0.4); vv(0.0,-0.4); EP;
  BP; vv(0.0,0.8); vv(0.8,0.0); vv(0.0,-0.8); vv(0.0,-0.4); vv(0.0,0.4); EP;
  set_outline_color(col);
  BC; vv(-0.8,-0.4); vv(-0.8,0.4); vv(0.0,0.4); vv(0.0,0.8); vv(0.8,0.0);
      vv(0.0,-0.8); vv(0.0,-0.4); EC;
}